

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

void ITStatus_setITState(ARM_ITStatus *it,char Firstcond,char Mask)

{
  byte v;
  undefined4 local_24;
  _Bool T;
  uint Pos;
  uchar CCBits;
  uint NumTZ;
  uint CondBit0;
  char Mask_local;
  char Firstcond_local;
  ARM_ITStatus *it_local;
  
  local_24 = CountTrailingZeros_32((int)Mask);
  v = Firstcond & 0xf;
  while (local_24 = local_24 + 1, local_24 < 4) {
    if (((int)Mask >> ((byte)local_24 & 0x1f) & 1U) == ((int)Firstcond & 1U)) {
      ITStatus_push_back(it,v);
    }
    else {
      ITStatus_push_back(it,v ^ 1);
    }
  }
  ITStatus_push_back(it,v);
  return;
}

Assistant:

static void ITStatus_setITState(ARM_ITStatus *it, char Firstcond, char Mask)
{
	// (3 - the number of trailing zeros) is the number of then / else.
	unsigned CondBit0 = Firstcond & 1;
	unsigned NumTZ = CountTrailingZeros_32(Mask);
	unsigned char CCBits = (unsigned char)Firstcond & 0xf;
	unsigned Pos;
	//assert(NumTZ <= 3 && "Invalid IT mask!");
	// push condition codes onto the stack the correct order for the pops
	for (Pos = NumTZ+1; Pos <= 3; ++Pos) {
		bool T = ((Mask >> Pos) & 1) == (int)CondBit0;
		if (T)
			ITStatus_push_back(it, CCBits);
		else
			ITStatus_push_back(it, CCBits ^ 1);
	}
	ITStatus_push_back(it, CCBits);
}